

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

uint * __thiscall PrimitiveTestClass::FillValues<unsigned_int*>(PrimitiveTestClass *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint *puVar3;
  ulong local_20;
  size_t i;
  uint *ret;
  PrimitiveTestClass *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->SIZE;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  puVar3 = (uint *)operator_new__(uVar2);
  for (local_20 = 0; local_20 < (ulong)(long)this->SIZE; local_20 = local_20 + 1) {
    puVar3[local_20] = 0xff;
  }
  return puVar3;
}

Assistant:

T FillValues()
        {
            T ret = new typename std::remove_pointer<T>::type[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                ret[i] = 0xFF;
            }
            
            return ret;
        }